

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

int insn_defines(virtual_insn *insn)

{
  undefined1 *in_RDI;
  int typ;
  int local_4;
  
  switch(*in_RDI) {
  case 0:
  case 0x16:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 1:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 2:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 3:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    local_4 = -1;
    break;
  case 4:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 5:
    if ((in_RDI[1] & 0x10) == 0) {
      local_4 = *(int *)(in_RDI + 8);
    }
    else {
      local_4 = -1;
    }
    break;
  case 6:
    if ((in_RDI[1] & 0x10) == 0) {
      local_4 = *(int *)(in_RDI + 8);
    }
    else {
      local_4 = -1;
    }
    break;
  case 7:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 8:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 9:
    local_4 = *(int *)(in_RDI + 8);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x17:
  case 0x18:
    local_4 = -1;
    break;
  case 0x14:
    if ((in_RDI[1] & 0xf) == 0xb) {
      local_4 = -1;
    }
    else {
      local_4 = *(int *)(in_RDI + 8);
    }
    break;
  case 0x15:
    local_4 = *(int *)(in_RDI + 8);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/dill/dill/virtual.c"
                  ,0x298,"int insn_defines(virtual_insn *)");
  }
  return local_4;
}

Assistant:

static int
insn_defines(virtual_insn* insn)
{
    switch (insn->class_code) {
    case iclass_arith3:
    case iclass_compare:
        return insn->opnds.a3.dest;
    case iclass_arith3i:
        return insn->opnds.a3i.dest;
    case iclass_arith2:
        return insn->opnds.a2.dest;
    case iclass_convert:
        return insn->opnds.a2.dest;
    case iclass_loadstorei:
        if (insn->insn_code & 0x10) {
            /* store */
            return -1;
        } else {
            return insn->opnds.a3i.dest;
        }
    case iclass_lea:
        return insn->opnds.a3i.dest;
    case iclass_loadstore:
        if (insn->insn_code & 0x10) {
            /* store */
            return -1;
        } else {
            return insn->opnds.a3.dest;
        }
    case iclass_set:
        return insn->opnds.a3i.dest;
    case iclass_setf:
        return insn->opnds.sf.dest;
    case iclass_mov:
        return insn->opnds.a2.dest;
    case iclass_reti:
    case iclass_ret:
    case iclass_branch:
    case iclass_branchi:
    case iclass_jump_to_label:
    case iclass_jump_to_reg:
    case iclass_jump_to_imm:
    case iclass_special:
        return -1;
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        /* put the return register definition in the next bb */
        if (typ != DILL_V) {
            return insn->opnds.calli.src;
        }
        return -1;
    }
    case iclass_push:
    case iclass_pushi:
    case iclass_pushf:
    case iclass_nop:
    case iclass_mark_label:
        return -1;
    default:
        assert(0);
    }
    return -1;
}